

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testaniminter.cpp
# Opt level: O0

void change_setting_proc(Am_Object *cmd)

{
  undefined1 uVar1;
  Am_Value *value;
  ostream *poVar2;
  ostream *poVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object local_180;
  uint local_174;
  Am_Object local_170;
  Am_Object local_168;
  Am_Image_Array local_160 [8];
  Am_Image_Array icon;
  int local_154;
  int i;
  uint local_144;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  uint local_124;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  uint local_104;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  uint local_e4;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  uint local_c4;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  uint local_a4;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  uint local_84;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_Input_Char local_1c;
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)cmd);
  value = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,value);
  poVar2 = std::operator<<((ostream *)&std::cout,"---- got ");
  poVar3 = (ostream *)operator<<(poVar2,(Am_Input_Char *)&local_1c);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar1 = Am_Input_Char::As_Char();
  switch(uVar1) {
  case 0x53:
    poVar2 = std::operator<<((ostream *)&std::cout," debugging setting only\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    Am_Set_Inter_Trace(Am_INTER_TRACE_SETTING);
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"** Illegal, want:\n");
    poVar2 = std::operator<<(poVar2," q = quit.\n");
    poVar2 = std::operator<<(poVar2," s = stop all animations\n");
    poVar2 = std::operator<<(poVar2," g = go (start all animations\n");
    poVar2 = std::operator<<(poVar2," i = pick icon index\n");
    poVar2 = std::operator<<(poVar2," l = left, right controls of walker\n");
    poVar2 = std::operator<<(poVar2," Debugging:\n");
    poVar2 = std::operator<<(poVar2,"    d=full-debug, h=short-debug, n=no-debug, S=setting only\n")
    ;
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    break;
  case 100:
    poVar2 = std::operator<<((ostream *)&std::cout," debugging all\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    break;
  case 0x67:
    poVar2 = std::operator<<((ostream *)&std::cout," go--starting all\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(&local_78,&anim1);
    Am_Object::Am_Object(&local_80,(Am_Object *)&Am_No_Object);
    local_84 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_90,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_78,(Am_Object_Data *)&local_80,
                        (Am_Input_Char *)(ulong)local_84,(Am_Object_Data *)&local_90,0,0,true);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_80);
    Am_Object::~Am_Object(&local_78);
    Am_Object::Am_Object(&local_98,&anim2);
    Am_Object::Am_Object(&local_a0,(Am_Object *)&Am_No_Object);
    local_a4 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_b0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_98,(Am_Object_Data *)&local_a0,
                        (Am_Input_Char *)(ulong)local_a4,(Am_Object_Data *)&local_b0,0,0,true);
    Am_Object::~Am_Object(&local_b0);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&local_98);
    Am_Object::Am_Object(&local_b8,&anim3);
    Am_Object::Am_Object(&local_c0,(Am_Object *)&Am_No_Object);
    local_c4 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_d0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_b8,(Am_Object_Data *)&local_c0,
                        (Am_Input_Char *)(ulong)local_c4,(Am_Object_Data *)&local_d0,0,0,true);
    Am_Object::~Am_Object(&local_d0);
    Am_Object::~Am_Object(&local_c0);
    Am_Object::~Am_Object(&local_b8);
    Am_Object::Am_Object(&local_d8,&anim4);
    Am_Object::Am_Object(&local_e0,(Am_Object *)&Am_No_Object);
    local_e4 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_f0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_d8,(Am_Object_Data *)&local_e0,
                        (Am_Input_Char *)(ulong)local_e4,(Am_Object_Data *)&local_f0,0,0,true);
    Am_Object::~Am_Object(&local_f0);
    Am_Object::~Am_Object(&local_e0);
    Am_Object::~Am_Object(&local_d8);
    Am_Object::Am_Object(&local_f8,&anim5);
    Am_Object::Am_Object(&local_100,(Am_Object *)&Am_No_Object);
    local_104 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_110,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_f8,(Am_Object_Data *)&local_100,
                        (Am_Input_Char *)(ulong)local_104,(Am_Object_Data *)&local_110,0,0,true);
    Am_Object::~Am_Object(&local_110);
    Am_Object::~Am_Object(&local_100);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::Am_Object(&local_118,&anim6);
    Am_Object::Am_Object(&local_120,(Am_Object *)&Am_No_Object);
    local_124 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_130,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_118,(Am_Object_Data *)&local_120,
                        (Am_Input_Char *)(ulong)local_124,(Am_Object_Data *)&local_130,0,0,true);
    Am_Object::~Am_Object(&local_130);
    Am_Object::~Am_Object(&local_120);
    Am_Object::~Am_Object(&local_118);
    Am_Object::Am_Object(&local_138,&anim7);
    Am_Object::Am_Object(&local_140,(Am_Object *)&Am_No_Object);
    local_144 = _Am_Default_Start_Char;
    Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffeb0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_138,(Am_Object_Data *)&local_140,
                        (Am_Input_Char *)(ulong)local_144,(Am_Object_Data *)&stack0xfffffffffffffeb0
                        ,0,0,true);
    Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffeb0);
    Am_Object::~Am_Object(&local_140);
    Am_Object::~Am_Object(&local_138);
    break;
  case 0x68:
    poVar2 = std::operator<<((ostream *)&std::cout," debugging SHORT\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Set_Inter_Trace(Am_INTER_TRACE_SHORT);
    break;
  case 0x69:
    poVar2 = std::operator<<((ostream *)&std::cout,"index of picture to load [0..11]: ");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,&local_154);
    pAVar4 = (Am_Value *)Am_Value_List::Get_Nth(0x10c368);
    Am_Image_Array::Am_Image_Array(local_160,pAVar4);
    pAVar5 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_160);
    Am_Object::Set(0xc398,(Am_Wrapper *)0xb0,(ulong)pAVar5);
    poVar2 = std::operator<<((ostream *)&std::cout,"Lists are: right = ");
    poVar2 = (ostream *)operator<<(poVar2,(Am_Value_List *)indices_right);
    poVar2 = std::operator<<(poVar2,"\n left = ");
    poVar3 = (ostream *)operator<<(poVar2,(Am_Value_List *)indices_left);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    Am_Image_Array::~Am_Image_Array(local_160);
    break;
  case 0x6c:
    Am_Object::Am_Object(&local_168,&anim7);
    Am_Object::Am_Object(&local_170,(Am_Object *)&Am_No_Object);
    local_174 = _Am_Default_Stop_Char;
    Am_Object::Am_Object(&local_180,(Am_Object *)&Am_No_Object);
    Am_Stop_Interactor((Am_Object_Data *)&local_168,(Am_Object_Data *)&local_170,
                       (Am_Input_Char *)(ulong)local_174,(Am_Object_Data *)&local_180,0,0,true);
    Am_Object::~Am_Object(&local_180);
    Am_Object::~Am_Object(&local_170);
    Am_Object::~Am_Object(&local_168);
    break;
  case 0x6e:
    poVar2 = std::operator<<((ostream *)&std::cout," debugging none\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    break;
  case 0x71:
    Am_Exit_Main_Event_Loop();
    break;
  case 0x73:
    poVar2 = std::operator<<((ostream *)&std::cout,"stopping all\n");
    std::ostream::operator<<((ostream *)poVar2,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(local_38,&anim1);
    Am_Abort_Interactor((Am_Object_Data *)local_38,true);
    Am_Object::~Am_Object(local_38);
    Am_Object::Am_Object(&local_40,&anim2);
    Am_Abort_Interactor((Am_Object_Data *)&local_40,true);
    Am_Object::~Am_Object(&local_40);
    Am_Object::Am_Object(&local_48,&anim3);
    Am_Abort_Interactor((Am_Object_Data *)&local_48,true);
    Am_Object::~Am_Object(&local_48);
    Am_Object::Am_Object(&local_50,&anim4);
    Am_Abort_Interactor((Am_Object_Data *)&local_50,true);
    Am_Object::~Am_Object(&local_50);
    Am_Object::Am_Object(&local_58,&anim5);
    Am_Abort_Interactor((Am_Object_Data *)&local_58,true);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Am_Object(&local_60,&anim6);
    Am_Abort_Interactor((Am_Object_Data *)&local_60,true);
    Am_Object::~Am_Object(&local_60);
    Am_Object::Am_Object(&local_68,&anim7);
    Am_Abort_Interactor((Am_Object_Data *)&local_68,true);
    Am_Object::~Am_Object(&local_68);
    Am_Object::Am_Object(&local_70,&anim8);
    Am_Abort_Interactor((Am_Object_Data *)&local_70,true);
    Am_Object::~Am_Object(&local_70);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  std::cout << "---- got " << c << std::endl;
  switch (c.As_Char()) {
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  case 's':
    std::cout << "stopping all\n" << std::flush;
    Am_Abort_Interactor(anim1);
    Am_Abort_Interactor(anim2);
    Am_Abort_Interactor(anim3);
    Am_Abort_Interactor(anim4);
    Am_Abort_Interactor(anim5);
    Am_Abort_Interactor(anim6);
    Am_Abort_Interactor(anim7);
    Am_Abort_Interactor(anim8);
    break;
  case 'g':
    std::cout << " go--starting all\n" << std::flush;
    Am_Start_Interactor(anim1);
    Am_Start_Interactor(anim2);
    Am_Start_Interactor(anim3);
    Am_Start_Interactor(anim4);
    Am_Start_Interactor(anim5);
    Am_Start_Interactor(anim6);
    Am_Start_Interactor(anim7);
    break;
  case 'i': {
    std::cout << "index of picture to load [0..11]: " << std::flush;
    int i;
    std::cin >> i;
    Am_Image_Array icon = pixmap_images.Get_Nth(i);
    eye_icon.Set(Am_IMAGE, icon);
    std::cout << "Lists are: right = " << indices_right
              << "\n left = " << indices_left << std::endl
              << std::flush;
    break;
  }
  case 'l': {
    Am_Stop_Interactor(anim7);
    break;
  }
  case 'd':
    std::cout << " debugging all\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    break;
  case 'h':
    std::cout << " debugging SHORT\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_SHORT);
    break;
  case 'n':
    std::cout << " debugging none\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    break;
  case 'S':
    std::cout << " debugging setting only\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    Am_Set_Inter_Trace(Am_INTER_TRACE_SETTING);
    break;
  default:
    std::cout << "** Illegal, want:\n"
              << " q = quit.\n"
              << " s = stop all animations\n"
              << " g = go (start all animations\n"
              << " i = pick icon index\n"
              << " l = left, right controls of walker\n"
              << " Debugging:\n"
              << "    d=full-debug, h=short-debug, n=no-debug, S=setting only\n"
              << std::endl
              << std::flush;
    break;
  } // end switch
}